

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeInternalForces
          (ChElementHexaANCF_3813 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_8,_3> *d0;
  JacobianType JVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  bool bVar34;
  double *pdVar35;
  void *pvVar36;
  undefined8 *puVar37;
  double *pdVar38;
  double *pdVar39;
  ulong uVar40;
  int i;
  long lVar41;
  long lVar42;
  ActualDstType actualDst;
  int ii;
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  double detJ0C;
  double E;
  double v;
  ChVectorN<double,_9> alpha_eas;
  ChVectorN<double,_9> HE;
  ChVectorN<double,_9> ResidHE;
  ChMatrixNM<double,_8,_3> d;
  ChVectorN<double,_81> KALPHAvec;
  ChMatrixNM<double,_9,_9> KALPHA;
  ChVectorN<double,_24> Finternal;
  ChMatrixNM<double,_9,_9> KALPHA1;
  ChMatrixNM<double,_6,_6> T0;
  ChVectorN<double,_216> GDEPSPvec;
  ChVectorN<double,_906> TempIntegratedResult;
  ChVectorN<double,_576> JACvec;
  ChMatrixNM<double,_9,_24> GDEPSP;
  ChMatrixNM<double,_24,_24> KTE;
  Brick_ForceAnalytical myformula;
  double local_8d28;
  double local_8d20;
  double local_8d18;
  undefined1 local_8d10 [16];
  undefined1 auStack_8d00 [16];
  undefined1 auStack_8cf0 [16];
  undefined1 auStack_8ce0 [16];
  double local_8cd0;
  Matrix<double,_9,_1,_0,_9,_1> local_8cc0;
  undefined1 local_8c60 [16];
  undefined1 local_8c50 [16];
  Matrix<double,_9,_1,_0,_9,_1> local_8c40;
  ChMatrixNM<double,_8,_3> local_8bc0;
  double local_8af0;
  double dStack_8ae8;
  double local_8ae0;
  double dStack_8ad8;
  double local_8ad0;
  double dStack_8ac8;
  double local_8ac0;
  double dStack_8ab8;
  double local_8ab0;
  double dStack_8aa8;
  double local_8aa0;
  double dStack_8a98;
  double local_8a90;
  double dStack_8a88;
  double local_8a80;
  double dStack_8a78;
  double local_8a70;
  double dStack_8a68;
  double local_8a60;
  double dStack_8a58;
  double local_8a50;
  double dStack_8a48;
  double local_8a40;
  double dStack_8a38;
  double local_8a30;
  double dStack_8a28;
  double local_8a20;
  double dStack_8a18;
  double local_8a10;
  double dStack_8a08;
  double local_8a00;
  double dStack_89f8;
  double local_89f0;
  double dStack_89e8;
  double local_89e0;
  double dStack_89d8;
  double local_89d0;
  double dStack_89c8;
  double local_89c0;
  double dStack_89b8;
  double local_89b0;
  double dStack_89a8;
  double local_89a0;
  double dStack_8998;
  double local_8990;
  double dStack_8988;
  double local_8980;
  double dStack_8978;
  double local_8970;
  double dStack_8968;
  double local_8960;
  double dStack_8958;
  double local_8950;
  double dStack_8948;
  double local_8940;
  double dStack_8938;
  double local_8930;
  double dStack_8928;
  double local_8920;
  double dStack_8918;
  double local_8910;
  double dStack_8908;
  double local_8900;
  double dStack_88f8;
  double local_88f0;
  double dStack_88e8;
  double local_88e0;
  double dStack_88d8;
  double local_88d0;
  double dStack_88c8;
  double local_88c0;
  double dStack_88b8;
  double local_88b0;
  double dStack_88a8;
  double local_88a0;
  double dStack_8898;
  double local_8890;
  double dStack_8888;
  double local_8880;
  double dStack_8878;
  double local_8870;
  undefined1 local_8860 [32];
  undefined1 local_8840 [32];
  undefined8 local_8810;
  undefined8 uStack_8808;
  undefined8 local_8800;
  undefined8 uStack_87f8;
  undefined8 uStack_87f0;
  undefined8 uStack_87e8;
  undefined8 uStack_87e0;
  undefined8 uStack_87d8;
  undefined8 uStack_87d0;
  undefined8 uStack_87c8;
  undefined8 local_87c0;
  undefined8 uStack_87b8;
  undefined8 uStack_87b0;
  undefined8 uStack_87a8;
  undefined8 uStack_87a0;
  undefined8 uStack_8798;
  undefined8 uStack_8790;
  undefined8 uStack_8788;
  undefined8 local_8780;
  undefined8 uStack_8778;
  undefined8 uStack_8770;
  undefined8 uStack_8768;
  undefined8 uStack_8760;
  undefined8 uStack_8758;
  undefined8 uStack_8750;
  undefined8 uStack_8748;
  undefined8 local_8740;
  undefined8 uStack_8738;
  undefined8 uStack_8730;
  undefined8 uStack_8728;
  undefined8 uStack_8720;
  undefined8 uStack_8718;
  undefined8 uStack_8710;
  undefined8 uStack_8708;
  undefined8 local_8700;
  undefined8 uStack_86f8;
  undefined8 uStack_86f0;
  undefined8 uStack_86e8;
  undefined8 uStack_86e0;
  undefined8 uStack_86d8;
  undefined8 uStack_86d0;
  undefined8 uStack_86c8;
  undefined8 local_86c0;
  undefined8 uStack_86b8;
  undefined8 uStack_86b0;
  undefined8 uStack_86a8;
  undefined8 uStack_86a0;
  undefined8 uStack_8698;
  undefined8 uStack_8690;
  undefined8 uStack_8688;
  undefined8 local_8680;
  undefined8 uStack_8678;
  undefined8 uStack_8670;
  undefined8 uStack_8668;
  undefined8 local_8660;
  undefined8 uStack_8658;
  undefined8 local_8650;
  undefined8 uStack_8648;
  undefined8 local_8640;
  undefined8 uStack_8638;
  undefined8 local_8630;
  undefined8 uStack_8628;
  undefined8 local_8620;
  undefined8 uStack_8618;
  undefined8 local_8610;
  undefined8 uStack_8608;
  undefined8 local_8600;
  undefined8 uStack_85f8;
  undefined8 local_85f0;
  undefined8 uStack_85e8;
  undefined8 local_85e0;
  undefined8 uStack_85d8;
  undefined8 local_85d0;
  undefined8 uStack_85c8;
  undefined8 local_85c0;
  undefined8 uStack_85b8;
  undefined8 local_85b0;
  undefined8 uStack_85a8;
  undefined8 local_85a0;
  undefined8 uStack_8598;
  undefined8 local_8590;
  double local_8580;
  double dStack_8578;
  double dStack_8570;
  double dStack_8568;
  double dStack_8560;
  double dStack_8558;
  double dStack_8550;
  double dStack_8548;
  double local_8540;
  double dStack_8538;
  double dStack_8530;
  double dStack_8528;
  double dStack_8520;
  double dStack_8518;
  double dStack_8510;
  double dStack_8508;
  double local_8500;
  double dStack_84f8;
  double dStack_84f0;
  double dStack_84e8;
  double dStack_84e0;
  double dStack_84d8;
  double dStack_84d0;
  double dStack_84c8;
  undefined8 local_8490;
  undefined8 uStack_8488;
  undefined8 local_8480;
  undefined8 uStack_8478;
  undefined8 uStack_8470;
  undefined8 uStack_8468;
  undefined8 uStack_8460;
  undefined8 uStack_8458;
  undefined8 uStack_8450;
  undefined8 uStack_8448;
  undefined8 local_8440;
  undefined8 uStack_8438;
  undefined8 uStack_8430;
  undefined8 uStack_8428;
  undefined8 uStack_8420;
  undefined8 uStack_8418;
  undefined8 uStack_8410;
  undefined8 uStack_8408;
  undefined8 local_8400;
  undefined8 uStack_83f8;
  undefined8 uStack_83f0;
  undefined8 uStack_83e8;
  undefined8 uStack_83e0;
  undefined8 uStack_83d8;
  undefined8 uStack_83d0;
  undefined8 uStack_83c8;
  undefined8 local_83c0;
  undefined8 uStack_83b8;
  undefined8 uStack_83b0;
  undefined8 uStack_83a8;
  undefined8 uStack_83a0;
  undefined8 uStack_8398;
  undefined8 uStack_8390;
  undefined8 uStack_8388;
  undefined8 local_8380;
  undefined8 uStack_8378;
  undefined8 uStack_8370;
  undefined8 uStack_8368;
  undefined8 uStack_8360;
  undefined8 uStack_8358;
  undefined8 uStack_8350;
  undefined8 uStack_8348;
  undefined8 local_8340;
  undefined8 uStack_8338;
  undefined8 uStack_8330;
  undefined8 uStack_8328;
  undefined8 uStack_8320;
  undefined8 uStack_8318;
  undefined8 uStack_8310;
  undefined8 uStack_8308;
  undefined8 local_8300;
  undefined8 uStack_82f8;
  undefined8 uStack_82f0;
  undefined8 uStack_82e8;
  undefined8 local_82e0;
  undefined8 uStack_82d8;
  undefined8 local_82d0;
  undefined8 uStack_82c8;
  undefined8 local_82c0;
  undefined8 uStack_82b8;
  undefined8 local_82b0;
  undefined8 uStack_82a8;
  undefined8 local_82a0;
  undefined8 uStack_8298;
  undefined8 local_8290;
  undefined8 uStack_8288;
  undefined8 local_8280;
  undefined8 uStack_8278;
  undefined8 local_8270;
  undefined8 uStack_8268;
  undefined8 local_8260;
  undefined8 uStack_8258;
  undefined8 local_8250;
  undefined8 uStack_8248;
  undefined8 local_8240;
  undefined8 uStack_8238;
  undefined8 local_8230;
  undefined8 uStack_8228;
  undefined8 local_8220;
  undefined8 uStack_8218;
  undefined8 local_8210;
  ChMatrixNM<double,_6,_6> local_8200;
  Matrix<double,_9,_9,_1,_9,_9> local_80c0;
  double dStack_7e38;
  double dStack_7e30;
  double dStack_7e28;
  double dStack_7e20;
  double dStack_7e18;
  double dStack_7e10;
  double dStack_7e08;
  double local_7e00;
  double dStack_7df8;
  double dStack_7df0;
  double dStack_7de8;
  double dStack_7de0;
  double dStack_7dd8;
  double dStack_7dd0;
  double dStack_7dc8;
  double local_7dc0;
  double dStack_7db8;
  double dStack_7db0;
  double dStack_7da8;
  double dStack_7da0;
  double dStack_7d98;
  double dStack_7d90;
  double dStack_7d88;
  double local_7d80;
  double dStack_7d78;
  double dStack_7d70;
  double dStack_7d68;
  double dStack_7d60;
  double dStack_7d58;
  double dStack_7d50;
  double dStack_7d48;
  double local_7d40;
  double dStack_7d38;
  double dStack_7d30;
  double dStack_7d28;
  double dStack_7d20;
  double dStack_7d18;
  double dStack_7d10;
  double dStack_7d08;
  double local_7d00;
  double dStack_7cf8;
  double dStack_7cf0;
  double dStack_7ce8;
  double dStack_7ce0;
  double dStack_7cd8;
  double dStack_7cd0;
  double dStack_7cc8;
  double local_7cc0;
  double dStack_7cb8;
  double dStack_7cb0;
  double dStack_7ca8;
  double dStack_7ca0;
  double dStack_7c98;
  double dStack_7c90;
  double dStack_7c88;
  double local_7c80;
  double dStack_7c78;
  double dStack_7c70;
  double dStack_7c68;
  double dStack_7c60;
  double dStack_7c58;
  double dStack_7c50;
  double dStack_7c48;
  double local_7c40;
  double dStack_7c38;
  double dStack_7c30;
  double dStack_7c28;
  double dStack_7c20;
  double dStack_7c18;
  double dStack_7c10;
  double dStack_7c08;
  double local_7c00;
  double dStack_7bf8;
  double dStack_7bf0;
  double dStack_7be8;
  double dStack_7be0;
  double dStack_7bd8;
  double dStack_7bd0;
  double dStack_7bc8;
  double local_7bc0;
  double dStack_7bb8;
  double dStack_7bb0;
  double dStack_7ba8;
  double dStack_7ba0;
  double dStack_7b98;
  double dStack_7b90;
  double dStack_7b88;
  double local_7b80;
  double dStack_7b78;
  double dStack_7b70;
  double dStack_7b68;
  double dStack_7b60;
  double dStack_7b58;
  double dStack_7b50;
  double dStack_7b48;
  double local_7b40;
  double dStack_7b38;
  double dStack_7b30;
  double dStack_7b28;
  double dStack_7b20;
  double dStack_7b18;
  double dStack_7b10;
  double dStack_7b08;
  double local_7b00;
  double dStack_7af8;
  double dStack_7af0;
  double dStack_7ae8;
  double dStack_7ae0;
  double dStack_7ad8;
  double dStack_7ad0;
  double dStack_7ac8;
  double local_7ac0;
  double dStack_7ab8;
  double dStack_7ab0;
  double dStack_7aa8;
  double dStack_7aa0;
  double dStack_7a98;
  double dStack_7a90;
  double dStack_7a88;
  double local_7a80;
  double dStack_7a78;
  double dStack_7a70;
  double dStack_7a68;
  double dStack_7a60;
  double dStack_7a58;
  double dStack_7a50;
  double dStack_7a48;
  double local_7a40;
  double dStack_7a38;
  double dStack_7a30;
  double dStack_7a28;
  double dStack_7a20;
  double dStack_7a18;
  double dStack_7a10;
  double dStack_7a08;
  Matrix<double,_906,_1,_0,_906,_1> local_79d0;
  undefined1 local_5d80 [16];
  double *local_5d70;
  variable_if_dynamic<long,__1> local_5d68;
  variable_if_dynamic<long,__1> local_5d60;
  Index local_5d58;
  undefined8 auStack_59c0 [11];
  undefined2 local_5968 [4];
  double adStack_5960 [4];
  Matrix<double,_9,_1,_0,_9,_1> local_5940;
  undefined8 auStack_58f8 [567];
  Matrix<double,_9,_24,_1,_9,_24> local_4740;
  undefined8 local_4080 [560];
  undefined8 auStack_2f00 [16];
  Brick_ForceAnalytical local_2e80;
  
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[0]
       = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[1]
       = *(double *)&peVar3->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[2]
       = *(double *)&peVar3->field_0x30;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[3]
       = *(double *)((long)&peVar4->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[4]
       = *(double *)&peVar4->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[5]
       = *(double *)&peVar4->field_0x30;
  peVar3 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[6]
       = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[7]
       = *(double *)&peVar3->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[8]
       = *(double *)&peVar3->field_0x30;
  peVar3 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[9]
       = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[10]
       = *(double *)&peVar3->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0xb] = *(double *)&peVar3->field_0x30;
  peVar3 = psVar2[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0xc] = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0xd] = *(double *)&peVar3->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0xe] = *(double *)&peVar3->field_0x30;
  peVar3 = psVar2[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0xf] = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x10] = *(double *)&peVar3->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x11] = *(double *)&peVar3->field_0x30;
  peVar3 = psVar2[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x12] = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x13] = *(double *)&peVar3->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x14] = *(double *)&peVar3->field_0x30;
  peVar3 = psVar2[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x15] = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x16] = *(double *)&peVar3->field_0x28;
  local_8bc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
  [0x17] = *(double *)&peVar3->field_0x30;
  peVar5 = (this->m_Material).
           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_8d18 = peVar5->v;
  local_8d20 = peVar5->E;
  lVar41 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar41 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar41 != 0) {
    memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar41 << 3);
  }
  local_8d10 = *(undefined1 (*) [16])
                (this->m_stock_alpha_EAS).
                super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array;
  auStack_8d00 = *(undefined1 (*) [16])
                  ((this->m_stock_alpha_EAS).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array + 2);
  auStack_8cf0 = *(undefined1 (*) [16])
                  ((this->m_stock_alpha_EAS).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array + 4);
  auStack_8ce0 = *(undefined1 (*) [16])
                  ((this->m_stock_alpha_EAS).
                   super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
                   array + 6);
  local_8cd0 = (this->m_stock_alpha_EAS).
               super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
               [8];
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8]
       = 0.0;
  d0 = &this->m_d0;
  do {
    auVar6._8_8_ = local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                   .m_data.array[1];
    auVar6._0_8_ = local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                   .m_data.array[0];
    local_8d10 = vsubpd_avx(local_8d10,auVar6);
    local_8840 = ZEXT1632(local_8d10);
    auVar31._8_8_ =
         local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3];
    auVar31._0_8_ =
         local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2];
    auStack_8d00 = vsubpd_avx(auStack_8d00,auVar31);
    auVar32._8_8_ =
         local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5];
    auVar32._0_8_ =
         local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4];
    auStack_8cf0 = vsubpd_avx(auStack_8cf0,auVar32);
    local_8860 = ZEXT1632(auStack_8cf0);
    auVar33._8_8_ =
         local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7];
    auVar33._0_8_ =
         local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6];
    auStack_8ce0 = vsubpd_avx(auStack_8ce0,auVar33);
    dVar7 = local_8cd0 -
            local_8c40.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
            .array[8];
    local_8500 = 0.0;
    dStack_84f8 = 0.0;
    dStack_84f0 = 0.0;
    dStack_84e8 = 0.0;
    dStack_84e0 = 0.0;
    dStack_84d8 = 0.0;
    dStack_84d0 = 0.0;
    dStack_84c8 = 0.0;
    local_8540 = 0.0;
    dStack_8538 = 0.0;
    dStack_8530 = 0.0;
    dStack_8528 = 0.0;
    dStack_8520 = 0.0;
    dStack_8518 = 0.0;
    dStack_8510 = 0.0;
    dStack_8508 = 0.0;
    local_8580 = 0.0;
    dStack_8578 = 0.0;
    dStack_8570 = 0.0;
    dStack_8568 = 0.0;
    dStack_8560 = 0.0;
    dStack_8558 = 0.0;
    dStack_8550 = 0.0;
    dStack_8548 = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [8] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [0] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [1] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [2] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [3] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [4] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [5] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [6] = 0.0;
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [7] = 0.0;
    local_8cd0 = dVar7;
    local_8c60 = auStack_8ce0;
    local_8c50 = auStack_8d00;
    memset(&local_4740,0,0x6c0);
    memset(&local_8810,0,0x288);
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [1] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [2] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [3] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [4] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [5] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [6] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [7] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [8] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [9] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [10] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xb] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xc] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xd] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xe] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0xf] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x10] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x11] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x12] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x13] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x14] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x15] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x16] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x17] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x18] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x19] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1a] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1b] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1c] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1d] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1e] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x1f] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x20] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x21] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x22] = 0.0;
    local_8200.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0x23] = 0.0;
    local_8d28 = 0.0;
    T0DetJElementCenterForEAS(this,d0,&local_8200,&local_8d28);
    if (this->m_isMooney == false) {
      Brick_ForceAnalytical::Brick_ForceAnalytical
                (&local_2e80,&local_8bc0,d0,this,&local_8200,&local_8d28,
                 (ChVectorN<double,_9> *)local_8d10,&local_8d20,&local_8d18);
    }
    else {
      Brick_ForceAnalytical::Brick_ForceAnalytical
                (&local_2e80,&local_8bc0,d0,this,&local_8200,&local_8d28,
                 (ChVectorN<double,_9> *)local_8d10);
    }
    memset(&local_79d0,0,0x1c50);
    ChQuadrature::Integrate3D<Eigen::Matrix<double,906,1,0,906,1>>
              (&local_79d0,
               &local_2e80.super_ChIntegrable3D<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>,-1.0,1.0,
               -1.0,1.0,-1.0,1.0,2);
    local_8580 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0];
    dStack_8578 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[1];
    dStack_8570 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[2];
    dStack_8568 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[3];
    dStack_8560 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[4];
    dStack_8558 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[5];
    dStack_8550 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[6];
    dStack_8548 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[7];
    local_8540 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[8];
    dStack_8538 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[9];
    dStack_8530 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[10];
    dStack_8528 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb];
    dStack_8520 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc];
    dStack_8518 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd];
    dStack_8510 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe];
    dStack_8508 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf];
    local_8500 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10];
    dStack_84f8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11];
    dStack_84f0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x12];
    dStack_84e8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13];
    dStack_84e0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x14];
    dStack_84d8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x15];
    dStack_84d0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x16];
    dStack_84c8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x17];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [0] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x18];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [1] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x19];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [2] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1a];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [3] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1b];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [4] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1c];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [5] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1d];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [6] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1e];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [7] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x1f];
    local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [8] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x20];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x21];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [1] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x22];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [2] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x23];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [3] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x24];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [4] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x25];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [5] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x26];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [6] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x27];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [7] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x28];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [8] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x29];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [9] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
          m_data.array[0x2a];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [10] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
           m_data.array[0x2b];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0xb] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
            m_data.array[0x2c];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0xc] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
            m_data.array[0x2d];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0xd] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
            m_data.array[0x2e];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0xe] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
            m_data.array[0x2f];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0xf] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
            m_data.array[0x30];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x10] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x31];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x11] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x32];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x12] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x33];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x13] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x34];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x14] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x35];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x15] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x36];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x16] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x37];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x17] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x38];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x18] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x39];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x19] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x3a];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x1a] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x3b];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x1b] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x3c];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x1c] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x3d];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x1d] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x3e];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x1e] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x3f];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x1f] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x40];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x20] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x41];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x21] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x42];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x22] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x43];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x23] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x44];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x24] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x45];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x25] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x46];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x26] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x47];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x27] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x48];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x28] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x49];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x29] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x4a];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x2a] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x4b];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x2b] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x4c];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x2c] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x4d];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x2d] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x4e];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x2e] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x4f];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x2f] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x50];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x30] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x51];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x31] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x52];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x32] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x53];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x33] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x54];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x34] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x55];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x35] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x56];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x36] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x57];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x37] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x58];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x38] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x59];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x39] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x5a];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x3a] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x5b];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x3b] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x5c];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x3c] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x5d];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x3d] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x5e];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x3e] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x5f];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x3f] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x60];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x40] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x61];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x41] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x62];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x42] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[99];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x43] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[100];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x44] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x65];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x45] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x66];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x46] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x67];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x47] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x68];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x48] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x69];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x49] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x6a];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x4a] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x6b];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x4b] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x6c];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x4c] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x6d];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x4d] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x6e];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x4e] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x6f];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x4f] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x70];
    local_80c0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
    [0x50] = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.m_storage.
             m_data.array[0x71];
    dStack_7e38 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x72];
    dStack_7e30 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x73];
    dStack_7e28 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x74];
    dStack_7e20 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x75];
    dStack_7e18 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x76];
    dStack_7e10 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x77];
    dStack_7e08 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x78];
    local_7e00 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x79];
    dStack_7df8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7a];
    dStack_7df0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7b];
    dStack_7de8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7c];
    dStack_7de0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7d];
    dStack_7dd8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7e];
    dStack_7dd0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x7f];
    dStack_7dc8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x80];
    local_7dc0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x81];
    dStack_7db8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x82];
    dStack_7db0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x83];
    dStack_7da8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x84];
    dStack_7da0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x85];
    dStack_7d98 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x86];
    dStack_7d90 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x87];
    dStack_7d88 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x88];
    local_7d80 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x89];
    dStack_7d78 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8a];
    dStack_7d70 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8b];
    dStack_7d68 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8c];
    dStack_7d60 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8d];
    dStack_7d58 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8e];
    dStack_7d50 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x8f];
    dStack_7d48 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x90];
    local_7d40 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x91];
    dStack_7d38 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x92];
    dStack_7d30 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x93];
    dStack_7d28 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x94];
    dStack_7d20 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x95];
    dStack_7d18 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x96];
    dStack_7d10 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x97];
    dStack_7d08 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x98];
    local_7d00 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x99];
    dStack_7cf8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9a];
    dStack_7cf0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9b];
    dStack_7ce8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9c];
    dStack_7ce0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9d];
    dStack_7cd8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9e];
    dStack_7cd0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x9f];
    dStack_7cc8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa0];
    local_7cc0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xa1];
    dStack_7cb8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa2];
    dStack_7cb0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa3];
    dStack_7ca8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa4];
    dStack_7ca0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa5];
    dStack_7c98 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa6];
    dStack_7c90 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa7];
    dStack_7c88 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xa8];
    local_7c80 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xa9];
    dStack_7c78 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xaa];
    dStack_7c70 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xab];
    dStack_7c68 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xac];
    dStack_7c60 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xad];
    dStack_7c58 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xae];
    dStack_7c50 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xaf];
    dStack_7c48 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb0];
    local_7c40 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xb1];
    dStack_7c38 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb2];
    dStack_7c30 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb3];
    dStack_7c28 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb4];
    dStack_7c20 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb5];
    dStack_7c18 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb6];
    dStack_7c10 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb7];
    dStack_7c08 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xb8];
    local_7c00 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xb9];
    dStack_7bf8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xba];
    dStack_7bf0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbb];
    dStack_7be8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbc];
    dStack_7be0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbd];
    dStack_7bd8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbe];
    dStack_7bd0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xbf];
    dStack_7bc8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc0];
    local_7bc0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xc1];
    dStack_7bb8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc2];
    dStack_7bb0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc3];
    dStack_7ba8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc4];
    dStack_7ba0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc5];
    dStack_7b98 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xc6];
    dStack_7b90 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[199];
    dStack_7b88 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[200];
    local_7b80 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xc9];
    dStack_7b78 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xca];
    dStack_7b70 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcb];
    dStack_7b68 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcc];
    dStack_7b60 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcd];
    dStack_7b58 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xce];
    dStack_7b50 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xcf];
    dStack_7b48 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd0];
    local_7b40 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xd1];
    dStack_7b38 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd2];
    dStack_7b30 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd3];
    dStack_7b28 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd4];
    dStack_7b20 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd5];
    dStack_7b18 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd6];
    dStack_7b10 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd7];
    dStack_7b08 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xd8];
    local_7b00 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xd9];
    dStack_7af8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xda];
    dStack_7af0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdb];
    dStack_7ae8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdc];
    dStack_7ae0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdd];
    dStack_7ad8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xde];
    dStack_7ad0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xdf];
    dStack_7ac8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe0];
    local_7ac0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xe1];
    dStack_7ab8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe2];
    dStack_7ab0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe3];
    dStack_7aa8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe4];
    dStack_7aa0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe5];
    dStack_7a98 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe6];
    dStack_7a90 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe7];
    dStack_7a88 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xe8];
    local_7a80 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xe9];
    dStack_7a78 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xea];
    dStack_7a70 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xeb];
    dStack_7a68 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xec];
    dStack_7a60 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xed];
    dStack_7a58 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xee];
    dStack_7a50 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xef];
    dStack_7a48 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf0];
    local_7a40 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xf1];
    dStack_7a38 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf2];
    dStack_7a30 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf3];
    dStack_7a28 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf4];
    dStack_7a20 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf5];
    dStack_7a18 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf6];
    dStack_7a10 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf7];
    dStack_7a08 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xf8];
    local_8af0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xf9];
    dStack_8ae8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xfa];
    local_8ae0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xfb];
    dStack_8ad8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xfc];
    local_8ad0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xfd];
    dStack_8ac8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0xfe];
    local_8ac0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0xff];
    dStack_8ab8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x100];
    local_8ab0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x101];
    dStack_8aa8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x102];
    local_8aa0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x103];
    dStack_8a98 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x104];
    local_8a90 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x105];
    dStack_8a88 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x106];
    local_8a80 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x107];
    dStack_8a78 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x108];
    local_8a70 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x109];
    dStack_8a68 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x10a];
    local_8a60 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10b];
    dStack_8a58 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x10c];
    local_8a50 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10d];
    dStack_8a48 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x10e];
    local_8a40 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x10f];
    dStack_8a38 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x110];
    local_8a30 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x111];
    dStack_8a28 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x112];
    local_8a20 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x113];
    dStack_8a18 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x114];
    local_8a10 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x115];
    dStack_8a08 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x116];
    local_8a00 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x117];
    dStack_89f8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x118];
    local_89f0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x119];
    dStack_89e8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11a];
    local_89e0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x11b];
    dStack_89d8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11c];
    local_89d0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x11d];
    dStack_89c8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x11e];
    local_89c0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x11f];
    dStack_89b8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x120];
    local_89b0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x121];
    dStack_89a8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x122];
    local_89a0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x123];
    dStack_8998 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x124];
    local_8990 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x125];
    dStack_8988 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x126];
    local_8980 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x127];
    dStack_8978 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x128];
    local_8970 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x129];
    dStack_8968 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x12a];
    local_8960 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[299];
    dStack_8958 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[300];
    local_8950 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x12d];
    dStack_8948 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x12e];
    local_8940 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x12f];
    dStack_8938 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x130];
    local_8930 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x131];
    dStack_8928 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x132];
    local_8920 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x133];
    dStack_8918 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x134];
    local_8910 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x135];
    dStack_8908 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x136];
    local_8900 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x137];
    dStack_88f8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x138];
    local_88f0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x139];
    dStack_88e8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13a];
    local_88e0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x13b];
    dStack_88d8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13c];
    local_88d0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x13d];
    dStack_88c8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x13e];
    local_88c0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x13f];
    dStack_88b8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x140];
    local_88b0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x141];
    dStack_88a8 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x142];
    local_88a0 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x143];
    dStack_8898 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x144];
    local_8890 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x145];
    dStack_8888 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x146];
    local_8880 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x147];
    dStack_8878 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                  m_storage.m_data.array[0x148];
    local_8870 = local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                 m_storage.m_data.array[0x149];
    pdVar39 = (double *)&local_5940;
    memcpy(pdVar39,local_79d0.super_PlainObjectBase<Eigen::Matrix<double,_906,_1,_0,_906,_1>_>.
                   m_storage.m_data.array + 0x14a,0x1200);
    pdVar35 = (double *)&local_4740;
    pdVar38 = (double *)&local_80c0;
    lVar41 = 0;
    do {
      lVar42 = 0;
      do {
        pdVar35[lVar42] = pdVar38[lVar42];
        lVar42 = lVar42 + 1;
      } while (lVar42 != 0x18);
      lVar41 = lVar41 + 1;
      pdVar38 = pdVar38 + 0x18;
      pdVar35 = pdVar35 + 0x18;
    } while (lVar41 != 9);
    puVar37 = &local_8810;
    pdVar35 = &local_8af0;
    lVar41 = 0;
    do {
      lVar42 = 0;
      do {
        puVar37[lVar42] = pdVar35[lVar42];
        lVar42 = lVar42 + 1;
      } while (lVar42 != 9);
      lVar41 = lVar41 + 1;
      pdVar35 = pdVar35 + 9;
      puVar37 = puVar37 + 9;
    } while (lVar41 != 9);
    puVar37 = local_4080;
    lVar41 = 0;
    do {
      lVar42 = 0;
      do {
        puVar37[lVar42] = pdVar39[lVar42];
        lVar42 = lVar42 + 1;
      } while (lVar42 != 0x18);
      lVar41 = lVar41 + 1;
      pdVar39 = pdVar39 + 0x18;
      puVar37 = puVar37 + 0x18;
    } while (lVar41 != 0x18);
    local_8490 = local_8810;
    uStack_8488 = uStack_8808;
    local_8480 = local_8800;
    uStack_8478 = uStack_87f8;
    uStack_8470 = uStack_87f0;
    uStack_8468 = uStack_87e8;
    uStack_8460 = uStack_87e0;
    uStack_8458 = uStack_87d8;
    uStack_8450 = uStack_87d0;
    uStack_8448 = uStack_87c8;
    local_8440 = local_87c0;
    uStack_8438 = uStack_87b8;
    uStack_8430 = uStack_87b0;
    uStack_8428 = uStack_87a8;
    uStack_8420 = uStack_87a0;
    uStack_8418 = uStack_8798;
    uStack_8410 = uStack_8790;
    uStack_8408 = uStack_8788;
    local_8400 = local_8780;
    uStack_83f8 = uStack_8778;
    uStack_83f0 = uStack_8770;
    uStack_83e8 = uStack_8768;
    uStack_83e0 = uStack_8760;
    uStack_83d8 = uStack_8758;
    uStack_83d0 = uStack_8750;
    uStack_83c8 = uStack_8748;
    local_83c0 = local_8740;
    uStack_83b8 = uStack_8738;
    uStack_83b0 = uStack_8730;
    uStack_83a8 = uStack_8728;
    uStack_83a0 = uStack_8720;
    uStack_8398 = uStack_8718;
    uStack_8390 = uStack_8710;
    uStack_8388 = uStack_8708;
    local_8380 = local_8700;
    uStack_8378 = uStack_86f8;
    uStack_8370 = uStack_86f0;
    uStack_8368 = uStack_86e8;
    uStack_8360 = uStack_86e0;
    uStack_8358 = uStack_86d8;
    uStack_8350 = uStack_86d0;
    uStack_8348 = uStack_86c8;
    local_8340 = local_86c0;
    uStack_8338 = uStack_86b8;
    uStack_8330 = uStack_86b0;
    uStack_8328 = uStack_86a8;
    uStack_8320 = uStack_86a0;
    uStack_8318 = uStack_8698;
    uStack_8310 = uStack_8690;
    uStack_8308 = uStack_8688;
    local_8300 = local_8680;
    uStack_82f8 = uStack_8678;
    uStack_82f0 = uStack_8670;
    uStack_82e8 = uStack_8668;
    local_82e0 = local_8660;
    uStack_82d8 = uStack_8658;
    local_82d0 = local_8650;
    uStack_82c8 = uStack_8648;
    local_82c0 = local_8640;
    uStack_82b8 = uStack_8638;
    local_82b0 = local_8630;
    uStack_82a8 = uStack_8628;
    local_82a0 = local_8620;
    uStack_8298 = uStack_8618;
    local_8290 = local_8610;
    uStack_8288 = uStack_8608;
    local_8280 = local_8600;
    uStack_8278 = uStack_85f8;
    local_8270 = local_85f0;
    uStack_8268 = uStack_85e8;
    local_8260 = local_85e0;
    uStack_8258 = uStack_85d8;
    local_8250 = local_85d0;
    uStack_8248 = uStack_85c8;
    local_8240 = local_85c0;
    uStack_8238 = uStack_85b8;
    local_8230 = local_85b0;
    uStack_8228 = uStack_85a8;
    local_8220 = local_85a0;
    uStack_8218 = uStack_8598;
    local_8210 = local_8590;
    JVar1 = this->m_flag_HE;
    if (JVar1 == NUMERICAL) {
LAB_006e17e8:
      bVar34 = false;
    }
    else {
      auVar44._8_8_ = 0;
      auVar44._0_8_ =
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[8] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[8] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[0] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[0] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[2] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[2] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[4] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[4] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[6] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[6] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[1] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[1] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[3] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[3] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[5] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[5] +
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[7] *
           local_8cc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
           array[7];
      auVar6 = vsqrtsd_avx(auVar44,auVar44);
      bVar34 = true;
      if (1e-05 <= auVar6._0_8_) {
        local_5968[0] = 0;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
        compute<Eigen::Matrix<double,9,9,1,9,9>>
                  ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)local_5d80,
                   (EigenBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)&local_8490);
        if ((char)local_5968[0] != '\0') {
          Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
          _solve_impl<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Matrix<double,9,1,0,9,1>>
                    ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)local_5d80,&local_8cc0,
                     &local_8c40);
          goto LAB_006e17e8;
        }
        goto LAB_006e1b06;
      }
    }
  } while ((JVar1 != NUMERICAL) && (!bVar34));
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x18)
  {
    pdVar39 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar39 != (double *)0x0) {
      free((void *)pdVar39[-1]);
    }
    pvVar36 = malloc(0x100);
    if (pvVar36 == (void *)0x0) {
      pdVar39 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar36 & 0xffffffffffffffc0) + 0x38) = pvVar36;
      pdVar39 = (double *)(((ulong)pvVar36 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar39 == (double *)0x0) {
      puVar37 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar37 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar37,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar39;
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x18;
  }
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x18)
  {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 24, 1>>, T1 = double, T2 = double]"
                 );
  }
  pdVar39 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar40 = 0xfffffffffffffff8;
  do {
    auVar43 = vsubpd_avx512f(ZEXT864(0) << 0x40,*(undefined1 (*) [64])(&local_8540 + uVar40));
    *(undefined1 (*) [64])(pdVar39 + uVar40 + 8) = auVar43;
    uVar40 = uVar40 + 8;
  } while (uVar40 < 0x10);
  if (this->m_flag_HE == ANALYTICAL) {
    auVar45._0_16_ = local_8860._0_16_;
    auVar45._16_16_ = local_8c60;
    auVar43 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(local_8c50,local_8840._0_16_)),auVar45,1);
    *(undefined1 (*) [64])
     (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
     m_storage.m_data.array = auVar43;
    (this->m_stock_alpha_EAS).super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
    .m_data.array[8] = dVar7;
    lVar41 = 0;
    pdVar39 = (double *)&local_80c0;
    do {
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [3] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [4] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [5] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [6] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [7] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [8] = 0.0;
      local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
      [lVar41] = 1.0;
      local_2e80.JAC11.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
      m_data.array[0x5b]._0_2_ = 0;
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
      compute<Eigen::Matrix<double,9,9,1,9,9>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)&local_2e80,
                 (EigenBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)&local_8810);
      if (local_2e80.JAC11.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
          m_storage.m_data.array[0x5b]._0_1_ == '\0') {
LAB_006e1b06:
        __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                      "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                      "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 9, 9, 1>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 9, 9, 1>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 9, 1>>]"
                     );
      }
      local_5d68.m_value = 0;
      local_5d58 = 1;
      local_5d80._0_8_ = pdVar39;
      local_5d70 = (double *)&local_80c0;
      local_5d60.m_value = lVar41;
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>>::
      _solve_impl<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,9,1,false>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,9,9,1,9,9>> *)&local_2e80,&local_5940,
                 (Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_9,_1,_false> *)local_5d80);
      lVar41 = lVar41 + 1;
      pdVar39 = pdVar39 + 1;
    } while (lVar41 != 9);
    local_5d80._8_8_ = &local_80c0;
    local_5d80._0_8_ = &local_4740;
    local_5d70 = (double *)&local_4740;
    memset(&local_2e80,0,0x1200);
    local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
    [0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
              ((Matrix<double,_24,_24,_1,_24,_24> *)&local_2e80,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>,_0>
                *)local_5d80,&local_4740,(Scalar *)&local_5940);
    lVar41 = 0x80;
    do {
      uVar8 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 8);
      uVar9 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x10);
      uVar10 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x18);
      uVar11 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x20);
      uVar12 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x28);
      uVar13 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x30);
      uVar14 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x38);
      uVar15 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x40);
      uVar16 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x48);
      uVar17 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x50);
      uVar18 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x58);
      uVar19 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x60);
      uVar20 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x68);
      uVar21 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x70);
      uVar22 = *(undefined8 *)((long)auStack_2f00 + lVar41 + 0x78);
      uVar23 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x80);
      uVar24 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x78);
      uVar25 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x70);
      uVar26 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x68);
      uVar27 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x60);
      uVar28 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x58);
      uVar29 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x50);
      uVar30 = *(undefined8 *)
                ((long)local_2e80.Fint.
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
                       m_data.array + lVar41 + -0x48);
      *(undefined8 *)((long)auStack_59c0 + lVar41) = *(undefined8 *)((long)auStack_2f00 + lVar41);
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 8) = uVar8;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x10) = uVar9;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x18) = uVar10;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x20) = uVar11;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x28) = uVar12;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x30) = uVar13;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x38) = uVar14;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x40) = uVar15;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x48) = uVar16;
      *(undefined8 *)((long)auStack_59c0 + lVar41 + 0x50) = uVar17;
      *(undefined8 *)((long)local_5968 + lVar41) = uVar18;
      *(undefined8 *)((long)adStack_5960 + lVar41) = uVar19;
      *(undefined8 *)((long)adStack_5960 + lVar41 + 8) = uVar20;
      *(undefined8 *)((long)adStack_5960 + lVar41 + 0x10) = uVar21;
      *(undefined8 *)((long)adStack_5960 + lVar41 + 0x18) = uVar22;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41) = uVar23;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41 + 8) = uVar24;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41 + 0x10) = uVar25;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41 + 0x18) = uVar26;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41 + 0x20) = uVar27;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41 + 0x28) = uVar28;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41 + 0x30) = uVar29;
      *(undefined8 *)
       ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array + lVar41 + 0x38) = uVar30;
      lVar41 = lVar41 + 0xc0;
    } while (lVar41 != 0x1280);
    lVar41 = 0;
    do {
      uVar8 = *(undefined8 *)((long)local_4080 + lVar41 + 8);
      uVar9 = *(undefined8 *)((long)local_4080 + lVar41 + 0x10);
      uVar10 = *(undefined8 *)((long)local_4080 + lVar41 + 0x18);
      uVar11 = *(undefined8 *)((long)local_4080 + lVar41 + 0x20);
      uVar12 = *(undefined8 *)((long)local_4080 + lVar41 + 0x28);
      uVar13 = *(undefined8 *)((long)local_4080 + lVar41 + 0x30);
      uVar14 = *(undefined8 *)((long)local_4080 + lVar41 + 0x38);
      puVar37 = (undefined8 *)
                ((long)(this->m_stock_KTE).
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                       m_data.array + lVar41);
      *puVar37 = *(undefined8 *)((long)local_4080 + lVar41);
      puVar37[1] = uVar8;
      puVar37[2] = uVar9;
      puVar37[3] = uVar10;
      puVar37[4] = uVar11;
      puVar37[5] = uVar12;
      puVar37[6] = uVar13;
      puVar37[7] = uVar14;
      uVar8 = *(undefined8 *)((long)local_4080 + lVar41 + 0x48);
      uVar9 = *(undefined8 *)((long)local_4080 + lVar41 + 0x50);
      uVar10 = *(undefined8 *)((long)local_4080 + lVar41 + 0x58);
      uVar11 = *(undefined8 *)((long)local_4080 + lVar41 + 0x60);
      uVar12 = *(undefined8 *)((long)local_4080 + lVar41 + 0x68);
      uVar13 = *(undefined8 *)((long)local_4080 + lVar41 + 0x70);
      uVar14 = *(undefined8 *)((long)local_4080 + lVar41 + 0x78);
      puVar37 = (undefined8 *)
                ((long)(this->m_stock_KTE).
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                       m_data.array + lVar41 + 0x40);
      *puVar37 = *(undefined8 *)((long)local_4080 + lVar41 + 0x40);
      puVar37[1] = uVar8;
      puVar37[2] = uVar9;
      puVar37[3] = uVar10;
      puVar37[4] = uVar11;
      puVar37[5] = uVar12;
      puVar37[6] = uVar13;
      puVar37[7] = uVar14;
      uVar8 = *(undefined8 *)((long)local_4080 + lVar41 + 0x88);
      uVar9 = *(undefined8 *)((long)local_4080 + lVar41 + 0x90);
      uVar10 = *(undefined8 *)((long)local_4080 + lVar41 + 0x98);
      uVar11 = *(undefined8 *)((long)local_4080 + lVar41 + 0xa0);
      uVar12 = *(undefined8 *)((long)local_4080 + lVar41 + 0xa8);
      uVar13 = *(undefined8 *)((long)local_4080 + lVar41 + 0xb0);
      uVar14 = *(undefined8 *)((long)local_4080 + lVar41 + 0xb8);
      puVar37 = (undefined8 *)
                ((long)(this->m_stock_KTE).
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                       m_data.array + lVar41 + 0x80);
      *puVar37 = *(undefined8 *)((long)local_4080 + lVar41 + 0x80);
      puVar37[1] = uVar8;
      puVar37[2] = uVar9;
      puVar37[3] = uVar10;
      puVar37[4] = uVar11;
      puVar37[5] = uVar12;
      puVar37[6] = uVar13;
      puVar37[7] = uVar14;
      lVar41 = lVar41 + 0xc0;
    } while (lVar41 != 0x1200);
    lVar41 = 0;
    do {
      uVar8 = *(undefined8 *)
               ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array + lVar41 + 8);
      uVar9 = *(undefined8 *)
               ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                      m_storage.m_data.array + lVar41 + 0x10);
      uVar10 = *(undefined8 *)
                ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                       m_storage.m_data.array + lVar41 + 0x18);
      uVar11 = *(undefined8 *)
                ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                       m_storage.m_data.array + lVar41 + 0x20);
      uVar12 = *(undefined8 *)
                ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                       m_storage.m_data.array + lVar41 + 0x28);
      uVar13 = *(undefined8 *)
                ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                       m_storage.m_data.array + lVar41 + 0x30);
      uVar14 = *(undefined8 *)
                ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                       m_storage.m_data.array + lVar41 + 0x38);
      puVar37 = (undefined8 *)
                ((long)(this->m_stock_jac_EAS).
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                       m_data.array + lVar41);
      *puVar37 = *(undefined8 *)
                  ((long)local_5940.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.
                         m_storage.m_data.array + lVar41);
      puVar37[1] = uVar8;
      puVar37[2] = uVar9;
      puVar37[3] = uVar10;
      puVar37[4] = uVar11;
      puVar37[5] = uVar12;
      puVar37[6] = uVar13;
      puVar37[7] = uVar14;
      uVar8 = *(undefined8 *)((long)auStack_58f8 + lVar41);
      uVar9 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 8);
      uVar10 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x10);
      uVar11 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x18);
      uVar12 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x20);
      uVar13 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x28);
      uVar14 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x30);
      puVar37 = (undefined8 *)
                ((long)(this->m_stock_jac_EAS).
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                       m_data.array + lVar41 + 0x40);
      *puVar37 = *(undefined8 *)((long)auStack_58f8 + lVar41 + -8);
      puVar37[1] = uVar8;
      puVar37[2] = uVar9;
      puVar37[3] = uVar10;
      puVar37[4] = uVar11;
      puVar37[5] = uVar12;
      puVar37[6] = uVar13;
      puVar37[7] = uVar14;
      uVar8 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x40);
      uVar9 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x48);
      uVar10 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x50);
      uVar11 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x58);
      uVar12 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x60);
      uVar13 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x68);
      uVar14 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x70);
      puVar37 = (undefined8 *)
                ((long)(this->m_stock_jac_EAS).
                       super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                       m_data.array + lVar41 + 0x80);
      *puVar37 = *(undefined8 *)((long)auStack_58f8 + lVar41 + 0x38);
      puVar37[1] = uVar8;
      puVar37[2] = uVar9;
      puVar37[3] = uVar10;
      puVar37[4] = uVar11;
      puVar37[5] = uVar12;
      puVar37[6] = uVar13;
      puVar37[7] = uVar14;
      lVar41 = lVar41 + 0xc0;
    } while (lVar41 != 0x1200);
  }
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    int ie = GetElemNum();

    ChVector<> pA = m_nodes[0]->GetPos();
    ChVector<> pB = m_nodes[1]->GetPos();
    ChVector<> pC = m_nodes[2]->GetPos();
    ChVector<> pD = m_nodes[3]->GetPos();
    ChVector<> pE = m_nodes[4]->GetPos();
    ChVector<> pF = m_nodes[5]->GetPos();
    ChVector<> pG = m_nodes[6]->GetPos();
    ChVector<> pH = m_nodes[7]->GetPos();

    ChMatrixNM<double, 8, 3> d;
    d(0, 0) = pA.x();
    d(0, 1) = pA.y();
    d(0, 2) = pA.z();
    d(1, 0) = pB.x();
    d(1, 1) = pB.y();
    d(1, 2) = pB.z();
    d(2, 0) = pC.x();
    d(2, 1) = pC.y();
    d(2, 2) = pC.z();
    d(3, 0) = pD.x();
    d(3, 1) = pD.y();
    d(3, 2) = pD.z();
    d(4, 0) = pE.x();
    d(4, 1) = pE.y();
    d(4, 2) = pE.z();
    d(5, 0) = pF.x();
    d(5, 1) = pF.y();
    d(5, 2) = pF.z();
    d(6, 0) = pG.x();
    d(6, 1) = pG.y();
    d(6, 2) = pG.z();
    d(7, 0) = pH.x();
    d(7, 1) = pH.y();
    d(7, 2) = pH.z();

    double v = m_Material->Get_v();
    double E = m_Material->Get_E();

    Fi.setZero();

    /// If numerical differentiation is used, only the internal force and EAS stiffness
    /// will be calculated. If the numerical differentiation is not used, the jacobian
    /// will also be calculated.
    bool use_numerical_differentiation = false;

    /// Internal force and EAS parameters are calculated for numerical differentiation.
    if (use_numerical_differentiation) {
        //////////////////////////////////////////////////////////////////////////////////////////////////////////
        ChVectorN<double, 330> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;

        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        /// Begin EAS loop
        while (fail == 1) {
            /// Update alpha EAS
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();
            HE.setZero();
            GDEPSP.setZero();
            KALPHA.setZero();

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);
            //== F_internal ==//
            // Choose constructors depending on m_isMooney
            Brick_ForceNumerical myformula =
                !m_isMooney ? Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceNumerical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 330>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            ///===============================================================//
            ///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            ///===TempIntegratedResult(24:32,1) -> HE(9x1)   brick   =========//
            ///===TempIntegratedResult(33:248,1) -> GDEPSP(9x24)     =========//
            ///===TempIntegratedResult(249:329,1) -> KALPHA(9x9)     =========//
            ///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            GDEPSP = Eigen::Map<ChMatrixNM<double, 9, 24>>(GDEPSPvec.data(), 9, 24);
            KALPHA = Eigen::Map<ChMatrixNM<double, 9, 9>>(KALPHAvec.data(), 9, 9);
            KALPHA1 = KALPHA;

            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();

            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
            if (m_flag_HE == ANALYTICAL && count > 2) {
                GetLog() << ie << "  count " << count << "  NormHE " << norm_HE << "\n";
            }
        }
        Fi = -Finternal;
        //== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        //== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    } else {
        ////////////////////////////////////////////////////////////////////////////////////////////////////////////

        ChVectorN<double, 906> TempIntegratedResult;
        ChVectorN<double, 24> Finternal;
        // Enhanced Assumed Strain (EAS)
        ChMatrixNM<double, 6, 6> T0;
        ChVectorN<double, 9> HE;
        ChMatrixNM<double, 9, 24> GDEPSP;
        ChMatrixNM<double, 9, 9> KALPHA;
        ChMatrixNM<double, 24, 24> KTE;
        ChMatrixNM<double, 9, 9> KALPHA1;
        ChVectorN<double, 9> ResidHE;
        double detJ0C;
        ChVectorN<double, 9> alpha_eas;
        ChVectorN<double, 9> renewed_alpha_eas;
        ChVectorN<double, 9> previous_alpha;

        previous_alpha = m_stock_alpha_EAS;
        alpha_eas = previous_alpha;
        ResidHE.setZero();
        int count = 0;
        int fail = 1;
        // Loop to obtain convergence in EAS internal parameters alpha
        // This loops call ChQuadrature::Integrate3D on MyAnalyticalForce,
        // which calculates the Jacobian at every iteration of each time step
        int iteralpha = 0;  //  Counts number of iterations
        while (fail == 1) {
            iteralpha++;
            alpha_eas = alpha_eas - ResidHE;
            renewed_alpha_eas = alpha_eas;

            Finternal.setZero();  // Internal force vector
            HE.setZero();         // Internal force vector from EAS
            GDEPSP.setZero();     // Jacobian of EAS forces w.r.t. coordinates
            KALPHA.setZero();     // Jacobian of EAS forces w.r.t. EAS internal parameters

            // Enhanced Assumed Strain (EAS)
            T0.setZero();
            detJ0C = 0.0;
            T0DetJElementCenterForEAS(m_d0, T0, detJ0C);

            //== F_internal ==//
            Brick_ForceAnalytical myformula =
                !m_isMooney ? Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas, &E, &v)
                            : Brick_ForceAnalytical(&d, &m_d0, this, &T0, &detJ0C, &alpha_eas);
            TempIntegratedResult.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 906>>(
                TempIntegratedResult,  // result of integration will go there
                myformula,             // formula to integrate
                -1,                    // start of x
                1,                     // end of x
                -1,                    // start of y
                1,                     // end of y
                -1,                    // start of z
                1,                     // end of z
                2                      // order of integration
            );

            //	///===============================================================//
            //	///===TempIntegratedResult(0:23,1) -> InternalForce(24x1)=========//
            //	///===TempIntegratedResult(24:28,1) -> HE(5x1)           =========//
            //	///===TempIntegratedResult(29:148,1) -> GDEPSP(5x24)     =========//
            //	///===TempIntegratedResult(149:173,1) -> KALPHA(5x5)     =========//
            //	///===TempIntegratedResult(174:749,1) -> Stiffness Matrix(24x24) =//
            //	///===============================================================//
            ChVectorN<double, 216> GDEPSPvec;
            ChVectorN<double, 81> KALPHAvec;
            ChVectorN<double, 576> JACvec;
            Finternal = TempIntegratedResult.segment(0, 24);
            HE = TempIntegratedResult.segment(24, 9);
            GDEPSPvec = TempIntegratedResult.segment(33, 216);
            KALPHAvec = TempIntegratedResult.segment(249, 81);
            JACvec = TempIntegratedResult.segment(330, 576);
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 24; j++) {
                    GDEPSP(i, j) = GDEPSPvec(i * 24 + j);
                }
            }
            // GDEPSP = GDEPSPvec;
            for (int i = 0; i < 9; i++) {
                for (int j = 0; j < 9; j++) {
                    KALPHA(i, j) = KALPHAvec(i * 9 + j);
                }
            }
            // KALPHA = KALPHAvec;
            for (int i = 0; i < 24; i++) {
                for (int j = 0; j < 24; j++) {
                    KTE(i, j) = JACvec(i * 24 + j);
                }
            }
            // KTE = JACvec;

            // Calculation of the element Jacobian for implicit integrator
            // KTE and stock_jac_EAS_elem.
            KALPHA1 = KALPHA;
            if (m_flag_HE == NUMERICAL)
                break;  // When numerical jacobian loop, no need to calculate HE
            count = count + 1;
            double norm_HE = HE.norm();
            if (norm_HE < 0.00001) {
                fail = 0;
            } else {
                // Solve for ResidHE
                ResidHE = KALPHA1.colPivHouseholderQr().solve(HE);
            }
        }  // end of while
        Fi = -Finternal;
        ////== Stock_Alpha=================//
        if (m_flag_HE == ANALYTICAL) {
            SetStockAlpha(renewed_alpha_eas(0), renewed_alpha_eas(1), renewed_alpha_eas(2), renewed_alpha_eas(3),
                          renewed_alpha_eas(4), renewed_alpha_eas(5), renewed_alpha_eas(6), renewed_alpha_eas(7),
                          renewed_alpha_eas(8));  // this->
        }
        ////== Jacobian Matrix for alpha ==//
        if (m_flag_HE == ANALYTICAL) {
            ChMatrixNM<double, 9, 9> INV_KALPHA;
            ChMatrixNM<double, 24, 24> stock_jac_EAS_elem;

            for (int ii = 0; ii < 9; ii++) {
                ChVectorN<double, 9> DAMMY_vec;
                DAMMY_vec.setZero();
                DAMMY_vec(ii) = 1.0;
                INV_KALPHA.col(ii) = KALPHA.colPivHouseholderQr().solve(DAMMY_vec);
            }
            stock_jac_EAS_elem = GDEPSP.transpose() * INV_KALPHA * GDEPSP;
            m_stock_KTE = KTE;
            m_stock_jac_EAS = stock_jac_EAS_elem;
        }
    }  // end of else for numerical or analytical
}